

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

void __thiscall
wabt::anon_unknown_1::WatWriter::WriteTypes(WatWriter *this,TypeVector *types,char *name)

{
  bool bVar1;
  size_type sVar2;
  reference pTVar3;
  Type type;
  const_iterator __end3;
  const_iterator __begin3;
  TypeVector *__range3;
  char *name_local;
  TypeVector *types_local;
  WatWriter *this_local;
  
  sVar2 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
  if (sVar2 != 0) {
    if (name != (char *)0x0) {
      WriteOpenSpace(this,name);
    }
    __end3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::begin(types);
    type = (Type)std::vector<wabt::Type,_std::allocator<wabt::Type>_>::end(types);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
                                       *)&type), bVar1) {
      pTVar3 = __gnu_cxx::
               __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>
               ::operator*(&__end3);
      WriteType(this,*pTVar3,Space);
      __gnu_cxx::
      __normal_iterator<const_wabt::Type_*,_std::vector<wabt::Type,_std::allocator<wabt::Type>_>_>::
      operator++(&__end3);
    }
    if (name != (char *)0x0) {
      WriteCloseSpace(this);
    }
  }
  return;
}

Assistant:

void WatWriter::WriteTypes(const TypeVector& types, const char* name) {
  if (types.size()) {
    if (name) {
      WriteOpenSpace(name);
    }
    for (Type type : types) {
      WriteType(type, NextChar::Space);
    }
    if (name) {
      WriteCloseSpace();
    }
  }
}